

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElDisc.cpp
# Opt level: O3

void __thiscall TPZCompElDisc::TPZCompElDisc(TPZCompElDisc *this)

{
  TPZReference *pTVar1;
  TPZReference *pTVar2;
  double local_38;
  
  *(undefined ***)&(this->super_TPZInterpolationSpace).super_TPZCompEl = &PTR__TPZSavable_01945230;
  TPZInterpolationSpace::TPZInterpolationSpace(&this->super_TPZInterpolationSpace,&PTR_PTR_01944b78)
  ;
  *(undefined ***)&(this->super_TPZInterpolationSpace).super_TPZCompEl =
       &PTR__TPZCompElDisc_01944808;
  pTVar1 = (TPZReference *)operator_new(0x10);
  (pTVar1->fCounter).super___atomic_base<int>._M_i = 0;
  pTVar1->fPointer = (TPZIntPoints *)0x0;
  LOCK();
  (pTVar1->fCounter).super___atomic_base<int>._M_i = 1;
  UNLOCK();
  (this->fIntRule).fRef = pTVar1;
  this->fConnectIndex = -1;
  pTVar2 = (TPZReference *)operator_new(0x10);
  (pTVar2->fCounter).super___atomic_base<int>._M_i = 0;
  pTVar2->fPointer = (TPZFunction<double> *)0x0;
  LOCK();
  (pTVar2->fCounter).super___atomic_base<int>._M_i = 1;
  UNLOCK();
  (this->fExternalShape).fRef = pTVar2;
  local_38 = 0.0;
  TPZManVector<double,_3>::TPZManVector(&this->fCenterPoint,3,&local_38);
  this->fShapefunctionType = ETensorial;
  TPZAutoPointer<TPZIntPoints>::operator=(&this->fIntRule,(TPZIntPoints *)0x0);
  this->fUseQsiEta = true;
  this->fConstC = 1.0;
  return;
}

Assistant:

TPZCompElDisc::TPZCompElDisc() : TPZRegisterClassId(&TPZCompElDisc::ClassId),
TPZInterpolationSpace(), fConnectIndex(-1), fExternalShape(), fCenterPoint(3,0.)
{
	this->fShapefunctionType = pzshape::TPZShapeDisc::ETensorial;
	this->fIntRule = NULL;
    fUseQsiEta = true;
    fConstC = 1.;

}